

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::V1LayerParameter::InternalSwap(V1LayerParameter *this,V1LayerParameter *other)

{
  int iVar1;
  uint32 uVar2;
  string *psVar3;
  V0LayerParameter *pVVar4;
  ConcatParameter *pCVar5;
  ConvolutionParameter *pCVar6;
  DataParameter *pDVar7;
  DropoutParameter *pDVar8;
  HDF5DataParameter *pHVar9;
  HDF5OutputParameter *pHVar10;
  ImageDataParameter *pIVar11;
  InfogainLossParameter *pIVar12;
  InnerProductParameter *pIVar13;
  LRNParameter *pLVar14;
  PoolingParameter *pPVar15;
  WindowDataParameter *pWVar16;
  PowerParameter *pPVar17;
  MemoryDataParameter *pMVar18;
  ArgMaxParameter *pAVar19;
  EltwiseParameter *pEVar20;
  ThresholdParameter *pTVar21;
  DummyDataParameter *pDVar22;
  AccuracyParameter *pAVar23;
  HingeLossParameter *pHVar24;
  ReLUParameter *pRVar25;
  SliceParameter *pSVar26;
  MVNParameter *pMVar27;
  TransformationParameter *pTVar28;
  TanHParameter *pTVar29;
  SigmoidParameter *pSVar30;
  SoftmaxParameter *pSVar31;
  ContrastiveLossParameter *pCVar32;
  ExpParameter *pEVar33;
  LossParameter *pLVar34;
  void *pvVar35;
  UnknownFieldSet *other_00;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->bottom_).super_RepeatedPtrFieldBase,
             &(other->bottom_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->top_).super_RepeatedPtrFieldBase,&(other->top_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->blobs_).super_RepeatedPtrFieldBase,&(other->blobs_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::RepeatedField<float>::InternalSwap(&this->blobs_lr_,&other->blobs_lr_);
  google::protobuf::RepeatedField<float>::InternalSwap(&this->weight_decay_,&other->weight_decay_);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->include_).super_RepeatedPtrFieldBase,
             &(other->include_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->exclude_).super_RepeatedPtrFieldBase,
             &(other->exclude_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<float>::InternalSwap(&this->loss_weight_,&other->loss_weight_);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->param_).super_RepeatedPtrFieldBase,&(other->param_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::RepeatedField<int>::InternalSwap
            (&this->blob_share_mode_,&other->blob_share_mode_);
  psVar3 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar3;
  pVVar4 = this->layer_;
  this->layer_ = other->layer_;
  other->layer_ = pVVar4;
  pCVar5 = this->concat_param_;
  this->concat_param_ = other->concat_param_;
  other->concat_param_ = pCVar5;
  pCVar6 = this->convolution_param_;
  this->convolution_param_ = other->convolution_param_;
  other->convolution_param_ = pCVar6;
  pDVar7 = this->data_param_;
  this->data_param_ = other->data_param_;
  other->data_param_ = pDVar7;
  pDVar8 = this->dropout_param_;
  this->dropout_param_ = other->dropout_param_;
  other->dropout_param_ = pDVar8;
  pHVar9 = this->hdf5_data_param_;
  this->hdf5_data_param_ = other->hdf5_data_param_;
  other->hdf5_data_param_ = pHVar9;
  pHVar10 = this->hdf5_output_param_;
  this->hdf5_output_param_ = other->hdf5_output_param_;
  other->hdf5_output_param_ = pHVar10;
  pIVar11 = this->image_data_param_;
  this->image_data_param_ = other->image_data_param_;
  other->image_data_param_ = pIVar11;
  pIVar12 = this->infogain_loss_param_;
  this->infogain_loss_param_ = other->infogain_loss_param_;
  other->infogain_loss_param_ = pIVar12;
  pIVar13 = this->inner_product_param_;
  this->inner_product_param_ = other->inner_product_param_;
  other->inner_product_param_ = pIVar13;
  pLVar14 = this->lrn_param_;
  this->lrn_param_ = other->lrn_param_;
  other->lrn_param_ = pLVar14;
  pPVar15 = this->pooling_param_;
  this->pooling_param_ = other->pooling_param_;
  other->pooling_param_ = pPVar15;
  pWVar16 = this->window_data_param_;
  this->window_data_param_ = other->window_data_param_;
  other->window_data_param_ = pWVar16;
  pPVar17 = this->power_param_;
  this->power_param_ = other->power_param_;
  other->power_param_ = pPVar17;
  pMVar18 = this->memory_data_param_;
  this->memory_data_param_ = other->memory_data_param_;
  other->memory_data_param_ = pMVar18;
  pAVar19 = this->argmax_param_;
  this->argmax_param_ = other->argmax_param_;
  other->argmax_param_ = pAVar19;
  pEVar20 = this->eltwise_param_;
  this->eltwise_param_ = other->eltwise_param_;
  other->eltwise_param_ = pEVar20;
  pTVar21 = this->threshold_param_;
  this->threshold_param_ = other->threshold_param_;
  other->threshold_param_ = pTVar21;
  pDVar22 = this->dummy_data_param_;
  this->dummy_data_param_ = other->dummy_data_param_;
  other->dummy_data_param_ = pDVar22;
  pAVar23 = this->accuracy_param_;
  this->accuracy_param_ = other->accuracy_param_;
  other->accuracy_param_ = pAVar23;
  pHVar24 = this->hinge_loss_param_;
  this->hinge_loss_param_ = other->hinge_loss_param_;
  other->hinge_loss_param_ = pHVar24;
  pRVar25 = this->relu_param_;
  this->relu_param_ = other->relu_param_;
  other->relu_param_ = pRVar25;
  pSVar26 = this->slice_param_;
  this->slice_param_ = other->slice_param_;
  other->slice_param_ = pSVar26;
  pMVar27 = this->mvn_param_;
  this->mvn_param_ = other->mvn_param_;
  other->mvn_param_ = pMVar27;
  pTVar28 = this->transform_param_;
  this->transform_param_ = other->transform_param_;
  other->transform_param_ = pTVar28;
  pTVar29 = this->tanh_param_;
  this->tanh_param_ = other->tanh_param_;
  other->tanh_param_ = pTVar29;
  pSVar30 = this->sigmoid_param_;
  this->sigmoid_param_ = other->sigmoid_param_;
  other->sigmoid_param_ = pSVar30;
  pSVar31 = this->softmax_param_;
  this->softmax_param_ = other->softmax_param_;
  other->softmax_param_ = pSVar31;
  pCVar32 = this->contrastive_loss_param_;
  this->contrastive_loss_param_ = other->contrastive_loss_param_;
  other->contrastive_loss_param_ = pCVar32;
  pEVar33 = this->exp_param_;
  this->exp_param_ = other->exp_param_;
  other->exp_param_ = pEVar33;
  pLVar34 = this->loss_param_;
  this->loss_param_ = other->loss_param_;
  other->loss_param_ = pLVar34;
  iVar1 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  uVar2 = (this->_has_bits_).has_bits_[1];
  (this->_has_bits_).has_bits_[1] = (other->_has_bits_).has_bits_[1];
  (other->_has_bits_).has_bits_[1] = uVar2;
  pvVar35 = (other->_internal_metadata_).
            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
            .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar35 & 1) == 0) goto LAB_004afe30;
LAB_004afe23:
    other_00 = (UnknownFieldSet *)((ulong)pvVar35 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar35 & 1) != 0) goto LAB_004afe23;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_004afe30:
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void V1LayerParameter::InternalSwap(V1LayerParameter* other) {
  bottom_.InternalSwap(&other->bottom_);
  top_.InternalSwap(&other->top_);
  blobs_.InternalSwap(&other->blobs_);
  blobs_lr_.InternalSwap(&other->blobs_lr_);
  weight_decay_.InternalSwap(&other->weight_decay_);
  include_.InternalSwap(&other->include_);
  exclude_.InternalSwap(&other->exclude_);
  loss_weight_.InternalSwap(&other->loss_weight_);
  param_.InternalSwap(&other->param_);
  blob_share_mode_.InternalSwap(&other->blob_share_mode_);
  name_.Swap(&other->name_);
  std::swap(layer_, other->layer_);
  std::swap(concat_param_, other->concat_param_);
  std::swap(convolution_param_, other->convolution_param_);
  std::swap(data_param_, other->data_param_);
  std::swap(dropout_param_, other->dropout_param_);
  std::swap(hdf5_data_param_, other->hdf5_data_param_);
  std::swap(hdf5_output_param_, other->hdf5_output_param_);
  std::swap(image_data_param_, other->image_data_param_);
  std::swap(infogain_loss_param_, other->infogain_loss_param_);
  std::swap(inner_product_param_, other->inner_product_param_);
  std::swap(lrn_param_, other->lrn_param_);
  std::swap(pooling_param_, other->pooling_param_);
  std::swap(window_data_param_, other->window_data_param_);
  std::swap(power_param_, other->power_param_);
  std::swap(memory_data_param_, other->memory_data_param_);
  std::swap(argmax_param_, other->argmax_param_);
  std::swap(eltwise_param_, other->eltwise_param_);
  std::swap(threshold_param_, other->threshold_param_);
  std::swap(dummy_data_param_, other->dummy_data_param_);
  std::swap(accuracy_param_, other->accuracy_param_);
  std::swap(hinge_loss_param_, other->hinge_loss_param_);
  std::swap(relu_param_, other->relu_param_);
  std::swap(slice_param_, other->slice_param_);
  std::swap(mvn_param_, other->mvn_param_);
  std::swap(transform_param_, other->transform_param_);
  std::swap(tanh_param_, other->tanh_param_);
  std::swap(sigmoid_param_, other->sigmoid_param_);
  std::swap(softmax_param_, other->softmax_param_);
  std::swap(contrastive_loss_param_, other->contrastive_loss_param_);
  std::swap(exp_param_, other->exp_param_);
  std::swap(loss_param_, other->loss_param_);
  std::swap(type_, other->type_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  std::swap(_has_bits_[1], other->_has_bits_[1]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}